

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPTCPTransmitter::SendRTPRTCPData(RTPTCPTransmitter *this,void *data,size_t len)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  ssize_t sVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  uint8_t lengthBytes [2];
  SocketType sock;
  vector<int,_std::allocator<int>_> errSockets;
  undefined1 local_4e;
  undefined1 local_4d;
  _Rb_tree_color local_4c;
  int *local_48;
  iterator iStack_40;
  int *local_38;
  
  iVar2 = -0xb5;
  if (((this->m_init == true) && (iVar2 = -0xbb, this->m_created == true)) &&
     (iVar2 = -0xc0, len < 0x10000)) {
    p_Var4 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
    local_48 = (int *)0x0;
    iStack_40._M_current = (int *)0x0;
    local_38 = (int *)0x0;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        local_4d = (undefined1)len;
        local_4c = p_Var4[1]._M_color;
        local_4e = (char)(len >> 8);
        sVar3 = send(local_4c,&local_4e,2,0x4000);
        if (sVar3 < 0) {
LAB_00127ed5:
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,(int *)&local_4c);
          }
          else {
            *iStack_40._M_current = local_4c;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        else {
          sVar3 = send(local_4c,data,len,0x4000);
          if (sVar3 < 0) goto LAB_00127ed5;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    if ((iStack_40._M_current != local_48) && (iStack_40._M_current != local_48)) {
      uVar5 = 0;
      do {
        (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[0x21])
                  (this,(ulong)(uint)local_48[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)iStack_40._M_current - (long)local_48 >> 2));
    }
    if (local_48 != (int *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int RTPTCPTransmitter::SendRTPRTCPData(const void *data, size_t len)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (len > RTPTCPTRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SPECIFIEDSIZETOOBIG;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();

	vector<SocketType> errSockets;
	int flags = 0;
#ifdef RTP_HAVE_MSG_NOSIGNAL
	flags = MSG_NOSIGNAL;
#endif // RTP_HAVE_MSG_NOSIGNAL

	while (it != end)
	{
		uint8_t lengthBytes[2] = { (uint8_t)((len >> 8)&0xff), (uint8_t)(len&0xff) };
		SocketType sock = it->first;

		if (send(sock,(const char *)lengthBytes,2,flags) < 0 ||
			send(sock,(const char *)data,len,flags) < 0)
			errSockets.push_back(sock);
		++it;
	}
	
	MAINMUTEX_UNLOCK

	if (errSockets.size() != 0)
	{
		for (size_t i = 0 ; i < errSockets.size() ; i++)
			OnSendError(errSockets[i]);
	}

	// Don't return an error code to avoid the poll thread exiting
	// due to one closed connection for example

	return 0;
}